

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  io_context io_context;
  string path;
  string host;
  Client client;
  
  if (argc != 3) {
    Help(*argv);
  }
  else {
    std::__cxx11::string::string((string *)&host,argv[1],(allocator *)&client);
    std::__cxx11::string::string((string *)&path,argv[2],(allocator *)&client);
    boost::asio::io_context::io_context(&io_context);
    Client::Client(&client,&io_context,&host,&path);
    boost::asio::io_context::run(&io_context);
    Client::~Client(&client);
    boost::asio::execution_context::~execution_context(&io_context.super_execution_context);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&host);
  }
  return (uint)(argc != 3);
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc != 3) {
    Help(argv[0]);
    return 1;
  }

  std::string host = argv[1];
  std::string path = argv[2];

  try {
    boost::asio::io_context io_context;

    Client client(io_context, host, path);

    io_context.run();

  } catch (const std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}